

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinDynamics.cpp
# Opt level: O0

void __thiscall OpenMD::LangevinDynamics::moveB(LangevinDynamics *this)

{
  bool bVar1;
  StuntDouble *in_RDI;
  RealType mass;
  Vector3d ji;
  Vector3d Tb;
  Vector3d frc;
  Vector3d vel;
  StuntDouble *sd;
  Molecule *mol;
  IntegrableObjectIterator j;
  MoleculeIterator i;
  StuntDouble *in_stack_fffffffffffffeb8;
  StuntDouble *in_stack_fffffffffffffec8;
  StuntDouble *in_stack_fffffffffffffed0;
  iterator *in_stack_fffffffffffffed8;
  SimInfo *in_stack_fffffffffffffee0;
  Rattle *in_stack_ffffffffffffff40;
  StuntDouble *in_stack_ffffffffffffff48;
  StuntDouble *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_18);
  Vector3<double>::Vector3((Vector3<double> *)0x208663);
  Vector3<double>::Vector3((Vector3<double> *)0x208670);
  Vector3<double>::Vector3((Vector3<double> *)0x20867d);
  Vector3<double>::Vector3((Vector3<double> *)0x20868a);
  local_20 = SimInfo::beginMolecule
                       (in_stack_fffffffffffffee0,(MoleculeIterator *)in_stack_fffffffffffffed8);
  while (local_20 != (Molecule *)0x0) {
    local_28 = Molecule::beginIntegrableObject
                         ((Molecule *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    while (local_28 != (StuntDouble *)0x0) {
      StuntDouble::getVel(in_stack_fffffffffffffec8);
      Vector3<double>::operator=
                ((Vector3<double> *)in_RDI,(Vector3<double> *)in_stack_fffffffffffffeb8);
      StuntDouble::getFrc(in_stack_fffffffffffffec8);
      Vector3<double>::operator=
                ((Vector3<double> *)in_RDI,(Vector3<double> *)in_stack_fffffffffffffeb8);
      StuntDouble::getMass(local_28);
      OpenMD::operator*((double)in_stack_fffffffffffffec8,(Vector<double,_3U> *)in_RDI);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffeb8);
      StuntDouble::setVel(in_stack_fffffffffffffed0,(Vector3d *)in_stack_fffffffffffffec8);
      bVar1 = StuntDouble::isDirectional(in_RDI);
      if (bVar1) {
        StuntDouble::getTrq(in_stack_fffffffffffffec8);
        StuntDouble::lab2Body(in_stack_ffffffffffffff48,(Vector3d *)in_stack_ffffffffffffff40);
        Vector3<double>::operator=((Vector3<double> *)in_RDI,(Vector3<double> *)local_28);
        StuntDouble::getJ(in_stack_fffffffffffffec8);
        Vector3<double>::operator=((Vector3<double> *)in_RDI,(Vector3<double> *)local_28);
        OpenMD::operator*((double)in_stack_fffffffffffffec8,(Vector<double,_3U> *)in_RDI);
        Vector<double,_3U>::operator+=((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)local_28);
        StuntDouble::setJ(in_stack_fffffffffffffed0,(Vector3d *)in_stack_fffffffffffffec8);
        in_stack_fffffffffffffeb8 = local_28;
      }
      local_28 = Molecule::nextIntegrableObject
                           ((Molecule *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    }
    local_20 = SimInfo::nextMolecule
                         (in_stack_fffffffffffffee0,(MoleculeIterator *)in_stack_fffffffffffffed8);
  }
  (*(in_RDI[1].snapshotMan_)->_vptr_SnapshotManager[6])();
  Rattle::constraintB(in_stack_ffffffffffffff40);
  return;
}

Assistant:

void LangevinDynamics::moveB() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d vel;
    Vector3d frc;
    Vector3d Tb;
    Vector3d ji;
    RealType mass;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel  = sd->getVel();
        frc  = sd->getFrc();
        mass = sd->getMass();

        // velocity half step
        vel += (dt2 / mass * Constants::energyConvert) * frc;

        sd->setVel(vel);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji += (dt2 * Constants::energyConvert) * Tb;

          sd->setJ(ji);
        }
      }
    }  // end for(mol = info_->beginMolecule(i))

    flucQ_->moveB();
    rattle_->constraintB();
  }